

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O0

QDateTime __thiscall QFileSystemMetaData::metadataChangeTime(QFileSystemMetaData *this)

{
  long lVar1;
  QTimeZone *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  Initialization in_stack_ffffffffffffff9c;
  qint64 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI[4].d.d == (QTimeZonePrivate *)0x0) {
    QDateTime::QDateTime((QDateTime *)0x2b298f);
  }
  else {
    QTimeZone::QTimeZone((QTimeZone *)in_RSI[4].d.d,in_stack_ffffffffffffff9c);
    QDateTime::fromMSecsSinceEpoch(in_stack_ffffffffffffffc8,in_RSI);
    QTimeZone::~QTimeZone((QTimeZone *)0x2b29a2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

inline QDateTime QFileSystemMetaData::metadataChangeTime() const
{
    return metadataChangeTime_
        ? QDateTime::fromMSecsSinceEpoch(metadataChangeTime_, QTimeZone::UTC)
        : QDateTime();
}